

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O3

void __thiscall RefCount::Release(RefCount *this)

{
  int *piVar1;
  int iVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  piVar1 = &this->mRefCount;
  *piVar1 = *piVar1 + -1;
  iVar2 = *piVar1;
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  if (iVar2 != 0) {
    return;
  }
  (**this->_vptr_RefCount)(this);
  return;
}

Assistant:

void Release() const
	{
		Mutex::EnterCriticalSection();
		mRefCount--; 
		//printf( "%p Release %d\n", this, mRefCount );
		if ( mRefCount == 0 )
		{
			Mutex::ExitCriticalSection();
			onRefCountZero();
		}
		else
			Mutex::ExitCriticalSection();
	}